

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

int mtbdd_map_contains(MTBDDMAP map,uint32_t key)

{
  int iVar1;
  uint32_t uVar2;
  mtbddnode_t n_00;
  uint32_t k;
  mtbddnode_t n;
  MTBDDMAP MStack_18;
  uint32_t key_local;
  MTBDDMAP map_local;
  
  MStack_18 = map;
  while( true ) {
    iVar1 = mtbdd_map_isempty(MStack_18);
    if (iVar1 != 0) {
      return 0;
    }
    n_00 = MTBDD_GETNODE(MStack_18);
    uVar2 = mtbddnode_getvariable(n_00);
    if (uVar2 == key) break;
    if (key < uVar2) {
      return 0;
    }
    MStack_18 = mtbddnode_followlow(MStack_18,n_00);
  }
  return 1;
}

Assistant:

int
mtbdd_map_contains(MTBDDMAP map, uint32_t key)
{
    while (!mtbdd_map_isempty(map)) {
        mtbddnode_t n = MTBDD_GETNODE(map);
        uint32_t k = mtbddnode_getvariable(n);
        if (k == key) return 1;
        if (k > key) return 0;
        map = node_getlow(map, n);
    }

    return 0;
}